

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void pmovsxbw_(PDISASM pMyDisasm)

{
  Int32 IVar1;
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    if ((pMyDisasm->Reserved_).VEX.pp == '\x01') {
      strcpy((pMyDisasm->Instruction).Mnemonic,"vpmovsxbw");
      if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
        (pMyDisasm->Reserved_).EVEX.tupletype = '\f';
      }
      if ((pMyDisasm->Reserved_).VEX.L == '\0') {
        IVar1 = 0x110000;
        if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
          IVar1 = 0x140000;
        }
        (pMyDisasm->Instruction).Category = IVar1;
        (pMyDisasm->Reserved_).Register_ = 4;
        (pMyDisasm->Reserved_).MemDecoration = 0x68;
        GxEx(pMyDisasm);
      }
      else if ((pMyDisasm->Reserved_).VEX.L == '\x01') {
        IVar1 = 0x120000;
        if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
          IVar1 = 0x140000;
        }
        (pMyDisasm->Instruction).Category = IVar1;
        (pMyDisasm->Reserved_).MemDecoration = 0x6d;
        (pMyDisasm->Reserved_).Register_ = 4;
        decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
        (pMyDisasm->Reserved_).Register_ = 8;
        decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
        (pMyDisasm->Reserved_).EIP_ =
             (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
      }
      else if ((pMyDisasm->Reserved_).EVEX.LL == '\x02') {
        (pMyDisasm->Instruction).Category = 0x140000;
        (pMyDisasm->Reserved_).MemDecoration = 0x6e;
        (pMyDisasm->Reserved_).Register_ = 8;
        decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
        (pMyDisasm->Reserved_).Register_ = 0x10;
        decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
        (pMyDisasm->Reserved_).EIP_ =
             (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
      }
    }
    else if ((pMyDisasm->Reserved_).VEX.pp == '\x02') {
      strcpy((pMyDisasm->Instruction).Mnemonic,"vpmovswb");
      if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
        (pMyDisasm->Reserved_).EVEX.tupletype = '\f';
      }
      if ((pMyDisasm->Reserved_).VEX.L == '\0') {
        IVar1 = 0x110000;
        if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
          IVar1 = 0x140000;
        }
        (pMyDisasm->Instruction).Category = IVar1;
        (pMyDisasm->Reserved_).Register_ = 4;
        (pMyDisasm->Reserved_).MemDecoration = 4;
        ExGx(pMyDisasm);
      }
      else if ((pMyDisasm->Reserved_).VEX.L == '\x01') {
        IVar1 = 0x120000;
        if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
          IVar1 = 0x140000;
        }
        (pMyDisasm->Instruction).Category = IVar1;
        (pMyDisasm->Reserved_).MemDecoration = 9;
        (pMyDisasm->Reserved_).Register_ = 4;
        decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
        (pMyDisasm->Reserved_).Register_ = 8;
        decodeRegOpcode(&pMyDisasm->Operand2,pMyDisasm);
        (pMyDisasm->Reserved_).EIP_ =
             (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
      }
      else if ((pMyDisasm->Reserved_).EVEX.LL == '\x02') {
        (pMyDisasm->Instruction).Category = 0x140000;
        (pMyDisasm->Reserved_).MemDecoration = 10;
        (pMyDisasm->Reserved_).Register_ = 8;
        decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
        (pMyDisasm->Reserved_).Register_ = 0x10;
        decodeRegOpcode(&pMyDisasm->Operand2,pMyDisasm);
        (pMyDisasm->Reserved_).EIP_ =
             (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else if ((pMyDisasm->Prefix).OperandSize == '\x01') {
    (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
    (pMyDisasm->Prefix).OperandSize = '\b';
    (pMyDisasm->Reserved_).MemDecoration = 0x68;
    (pMyDisasm->Instruction).Category = 0x80014;
    strcpy((pMyDisasm->Instruction).Mnemonic,"pmovsxbw");
    (pMyDisasm->Reserved_).Register_ = 4;
    GxEx(pMyDisasm);
  }
  else {
    failDecode(pMyDisasm);
  }
  return;
}

Assistant:

void __bea_callspec__ pmovsxbw_(PDISASM pMyDisasm)
{
 if (GV.VEX.state == InUsePrefix) {
   if (GV.VEX.pp == 0x1) {
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpmovsxbw");
     #endif
     if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = HALF_MEM;
     if (GV.VEX.L == 0) {
       pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
       GV.Register_ = SSE_REG;
       GV.MemDecoration = Arg2qword;
       GxEx(pMyDisasm);
     }
     else if (GV.VEX.L == 0x1) {
       pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX2_INSTRUCTION;
       GV.MemDecoration = Arg2_m128_xmm;
       GV.Register_ = SSE_REG;
       decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
       GV.Register_ = AVX_REG;
       decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
       GV.EIP_ += GV.DECALAGE_EIP+2;
     }
     else if (GV.EVEX.LL == 0x2) {
       pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
       GV.MemDecoration = Arg2_m256_ymm;
       GV.Register_ = AVX_REG;
       decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
       GV.Register_ = AVX512_REG;
       decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
       GV.EIP_ += GV.DECALAGE_EIP+2;
     }
   }
   else if (GV.VEX.pp == 0x2) {
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpmovswb");
     #endif
     if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = HALF_MEM;
     if (GV.VEX.L == 0) {
       pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
       GV.Register_ = SSE_REG;
       GV.MemDecoration = Arg1qword;
       ExGx(pMyDisasm);
     }
     else if (GV.VEX.L == 0x1) {
       pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX2_INSTRUCTION;
       GV.MemDecoration = Arg1_m128_xmm;
       GV.Register_ = SSE_REG;
       decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
       GV.Register_ = AVX_REG;
       decodeRegOpcode(&pMyDisasm->Operand2, pMyDisasm);
       GV.EIP_ += GV.DECALAGE_EIP+2;
     }
     else if (GV.EVEX.LL == 0x2) {
       pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
       GV.MemDecoration = Arg1_m256_ymm;
       GV.Register_ = AVX_REG;
       decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
       GV.Register_ = AVX512_REG;
       decodeRegOpcode(&pMyDisasm->Operand2, pMyDisasm);
       GV.EIP_ += GV.DECALAGE_EIP+2;
     }
   }
   else {
     failDecode(pMyDisasm);
   }

 }
 else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
   GV.OperandSize = GV.OriginalOperandSize;
   pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
   GV.MemDecoration = Arg2qword;
   pMyDisasm->Instruction.Category = SSE41_INSTRUCTION+CONVERSION_INSTRUCTION;
   #ifndef BEA_LIGHT_DISASSEMBLY
      (void) strcpy (pMyDisasm->Instruction.Mnemonic, "pmovsxbw");
   #endif
   GV.Register_ = SSE_REG;
   GxEx(pMyDisasm);

 }
 else {
   failDecode(pMyDisasm);
 }
}